

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

void finalize_source(parser *p)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  io_buf *piVar4;
  
  iVar3 = fileno(_stdin);
  piVar4 = p->input;
  piVar2 = (piVar4->files)._end;
  if ((piVar4->files)._begin != piVar2) {
    iVar1 = piVar2[-1];
    while (iVar1 == iVar3) {
      (piVar4->files)._end = piVar2 + -1;
      piVar4 = p->input;
      piVar2 = (piVar4->files)._end;
      if ((piVar4->files)._begin == piVar2) break;
      iVar1 = piVar2[-1];
    }
  }
  do {
    iVar3 = (*piVar4->_vptr_io_buf[8])(piVar4);
  } while ((char)iVar3 != '\0');
  if (p->input != (io_buf *)0x0) {
    (*p->input->_vptr_io_buf[3])();
  }
  p->input = (io_buf *)0x0;
  piVar4 = p->output;
  do {
    iVar3 = (*piVar4->_vptr_io_buf[8])(piVar4);
  } while ((char)iVar3 != '\0');
  if (p->output != (io_buf *)0x0) {
    (*p->output->_vptr_io_buf[3])();
  }
  p->output = (io_buf *)0x0;
  return;
}

Assistant:

void finalize_source(parser* p)
{
#ifdef _WIN32
  int f = _fileno(stdin);
#else
  int f = fileno(stdin);
#endif
  while (!p->input->files.empty() && p->input->files.last() == f) p->input->files.pop();
  p->input->close_files();

  delete p->input;
  p->input = nullptr;
  p->output->close_files();
  delete p->output;
  p->output = nullptr;
}